

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

void ft_trig_pseudo_polarize(PVG_FT_Vector *vec)

{
  long lVar1;
  long lVar2;
  long lVar3;
  PVG_FT_Fixed v2;
  PVG_FT_Fixed v1;
  PVG_FT_Fixed *arctanptr;
  PVG_FT_Fixed b;
  PVG_FT_Fixed xtemp;
  PVG_FT_Fixed y;
  PVG_FT_Fixed x;
  ulong uStack_18;
  PVG_FT_Int i;
  PVG_FT_Angle theta;
  PVG_FT_Vector *vec_local;
  
  lVar3 = vec->x;
  xtemp = vec->y;
  if (lVar3 < xtemp) {
    if (-lVar3 < xtemp) {
      uStack_18 = 0x5a0000;
      y = xtemp;
      xtemp = lVar3;
    }
    else {
      uStack_18 = -0xb40000;
      if (0 < xtemp) {
        uStack_18 = 0xb40000;
      }
      y = -lVar3;
    }
    xtemp = -xtemp;
  }
  else if (xtemp < -lVar3) {
    uStack_18 = -0x5a0000;
    y = -xtemp;
    xtemp = lVar3;
  }
  else {
    uStack_18 = 0;
    y = lVar3;
  }
  v1 = (PVG_FT_Fixed)ft_trig_arctan_table;
  arctanptr = (PVG_FT_Fixed *)0x1;
  for (x._4_4_ = 1; x._4_4_ < 0x17; x._4_4_ = x._4_4_ + 1) {
    lVar2 = xtemp + (long)arctanptr >> ((byte)x._4_4_ & 0x3f);
    lVar3 = y + (long)arctanptr >> ((byte)x._4_4_ & 0x3f);
    if (xtemp < 1) {
      lVar2 = -lVar2;
      lVar1 = -*(long *)v1;
    }
    else {
      lVar3 = -lVar3;
      lVar1 = *(long *)v1;
    }
    uStack_18 = lVar1 + uStack_18;
    y = y + lVar2;
    xtemp = xtemp + lVar3;
    v1 = v1 + 8;
    arctanptr = (PVG_FT_Fixed *)((long)arctanptr << 1);
  }
  if ((long)uStack_18 < 0) {
    uStack_18 = -(0x10 - uStack_18 & 0xffffffffffffffe0);
  }
  else {
    uStack_18 = uStack_18 + 0x10 & 0xffffffffffffffe0;
  }
  vec->x = y;
  vec->y = uStack_18;
  return;
}

Assistant:

static void ft_trig_pseudo_polarize(PVG_FT_Vector* vec)
{
    PVG_FT_Angle        theta;
    PVG_FT_Int          i;
    PVG_FT_Fixed        x, y, xtemp, b;
    const PVG_FT_Fixed* arctanptr;

    x = vec->x;
    y = vec->y;

    /* Get the vector into [-PI/4,PI/4] sector */
    if (y > x) {
        if (y > -x) {
            theta = PVG_FT_ANGLE_PI2;
            xtemp = y;
            y = -x;
            x = xtemp;
        } else {
            theta = y > 0 ? PVG_FT_ANGLE_PI : -PVG_FT_ANGLE_PI;
            x = -x;
            y = -y;
        }
    } else {
        if (y < -x) {
            theta = -PVG_FT_ANGLE_PI2;
            xtemp = -y;
            y = x;
            x = xtemp;
        } else {
            theta = 0;
        }
    }

    arctanptr = ft_trig_arctan_table;

    /* Pseudorotations, with right shifts */
    for (i = 1, b = 1; i < PVG_FT_TRIG_MAX_ITERS; b <<= 1, i++) {
        PVG_FT_Fixed v1 = ((y + b) >> i);
        PVG_FT_Fixed v2 = ((x + b) >> i);
        if (y > 0) {
            xtemp = x + v1;
            y = y - v2;
            x = xtemp;
            theta += *arctanptr++;
        } else {
            xtemp = x - v1;
            y = y + v2;
            x = xtemp;
            theta -= *arctanptr++;
        }
    }

    /* round theta */
    if (theta >= 0)
        theta = PVG_FT_PAD_ROUND(theta, 32);
    else
        theta = -PVG_FT_PAD_ROUND(-theta, 32);

    vec->x = x;
    vec->y = theta;
}